

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.h
# Opt level: O2

void __thiscall google::protobuf::compiler::cpp::CppGenerator::~CppGenerator(CppGenerator *this)

{
  *(code **)this = _ITM_deregisterTMCloneTable;
  std::__cxx11::string::~string((string *)(this + 0x10));
  google::protobuf::compiler::CodeGenerator::~CodeGenerator((CodeGenerator *)this);
  return;
}

Assistant:

~CppGenerator() override = default;